

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerFrame.hpp
# Opt level: O2

bool __thiscall Husky::ServerFrame::BindToLocalHost(ServerFrame *this,SOCKET *sock,u_short nPort)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  bool bVar4;
  allocator local_51;
  string local_50;
  int nRet;
  sockaddr_in addrSock;
  
  iVar1 = socket(2,1,0);
  *sock = iVar1;
  if (iVar1 == -1) {
    std::__cxx11::string::string((string *)&local_50,"error [%s]",(allocator *)&addrSock);
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    Limonp::Logger::LoggingF(3,"ServerFrame.hpp",0xae,&local_50,pcVar3);
    std::__cxx11::string::~string((string *)&local_50);
    bVar4 = false;
  }
  else {
    nRet = 1;
    iVar1 = setsockopt(this->m_lsnSock,1,2,&nRet,4);
    if (iVar1 == -1) {
      std::__cxx11::string::string((string *)&local_50,"error [%s]",(allocator *)&addrSock);
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      Limonp::Logger::LoggingF(3,"ServerFrame.hpp",0xb5,&local_50,pcVar3);
      std::__cxx11::string::~string((string *)&local_50);
    }
    addrSock.sin_family = 2;
    addrSock.sin_port = nPort << 8 | nPort >> 8;
    addrSock.sin_addr.s_addr = 0;
    iVar1 = bind(*sock,(sockaddr *)&addrSock,0x10);
    bVar4 = iVar1 != -1;
    if (!bVar4) {
      std::__cxx11::string::string((string *)&local_50,"error [%s]",&local_51);
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      Limonp::Logger::LoggingF(3,"ServerFrame.hpp",0xc0,&local_50,pcVar3);
      std::__cxx11::string::~string((string *)&local_50);
      close(*sock);
    }
  }
  return bVar4;
}

Assistant:

bool BindToLocalHost(SOCKET &sock,u_short nPort)   
            {
                sock=socket(AF_INET,SOCK_STREAM,0);
                if(INVALID_SOCKET==sock)
                {
                    LogError("error [%s]", strerror(errno));
                    return false;
                }

                int nRet = 1;
                if(SOCKET_ERROR==setsockopt(m_lsnSock, SOL_SOCKET, SO_REUSEADDR, (char*)&nRet, sizeof(nRet)))
                {	
                    LogError("error [%s]", strerror(errno));
                }

                struct sockaddr_in addrSock;
                addrSock.sin_family=AF_INET;
                addrSock.sin_port=htons(nPort);
                addrSock.sin_addr.s_addr=htonl(INADDR_ANY);
                int retval;
                retval = ::bind(sock,(sockaddr*)&addrSock,sizeof(sockaddr));
                if(SOCKET_ERROR==retval)
                {
                    LogError("error [%s]", strerror(errno));
                    closesocket(sock);
                    return false;
                }

                return true;

            }